

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

void delete_variable_declaration(Context_conflict *ctx,MOJOSHADER_astVariableDeclaration *dcl)

{
  MOJOSHADER_astScalarOrArray *pMVar1;
  MOJOSHADER_astVariableLowLevel *pMVar2;
  
  if (dcl != (MOJOSHADER_astVariableDeclaration *)0x0) {
    delete_variable_declaration(ctx,dcl->next);
    pMVar1 = dcl->details;
    if (pMVar1 != (MOJOSHADER_astScalarOrArray *)0x0) {
      delete_expr(ctx,pMVar1->dimension);
      (*ctx->free)(pMVar1,ctx->malloc_data);
    }
    delete_annotation(ctx,dcl->annotations);
    delete_expr(ctx,dcl->initializer);
    pMVar2 = dcl->lowlevel;
    if (pMVar2 != (MOJOSHADER_astVariableLowLevel *)0x0) {
      if (pMVar2->packoffset != (MOJOSHADER_astPackOffset *)0x0) {
        (*ctx->free)(pMVar2->packoffset,ctx->malloc_data);
      }
      (*ctx->free)(pMVar2,ctx->malloc_data);
    }
    (*ctx->free)(dcl,ctx->malloc_data);
    return;
  }
  return;
}

Assistant:

static void delete_variable_declaration(Context *ctx,
                                        MOJOSHADER_astVariableDeclaration *dcl)
{
    DELETE_AST_NODE(dcl);
    delete_variable_declaration(ctx, dcl->next);
    delete_scalar_or_array(ctx, dcl->details);
    delete_annotation(ctx, dcl->annotations);
    delete_expr(ctx, dcl->initializer);
    delete_variable_lowlevel(ctx, dcl->lowlevel);
    Free(ctx, dcl);
}